

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O1

void __thiscall NaVector::revert(NaVector *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint uVar6;
  ulong uVar7;
  
  uVar3 = (*this->_vptr_NaVector[6])();
  uVar4 = (*this->_vptr_NaVector[6])(this);
  if (1 < uVar4) {
    uVar7 = 0;
    do {
      uVar3 = uVar3 - 1;
      iVar5 = (*this->_vptr_NaVector[7])(this,uVar7);
      uVar1 = *(undefined8 *)CONCAT44(extraout_var,iVar5);
      iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar3);
      uVar2 = *(undefined8 *)CONCAT44(extraout_var_00,iVar5);
      iVar5 = (*this->_vptr_NaVector[7])(this,uVar7);
      *(undefined8 *)CONCAT44(extraout_var_01,iVar5) = uVar2;
      iVar5 = (*this->_vptr_NaVector[7])(this,(ulong)uVar3);
      *(undefined8 *)CONCAT44(extraout_var_02,iVar5) = uVar1;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar4 >> 1 != uVar6);
  }
  return;
}

Assistant:

void
NaVector::revert ()
{
  NaReal	tmp;
  int		i, N = dim(), N_2 = dim()/2;
  for(i = 0; i < N_2; ++i){
    tmp = fetch(i);
    fetch(i) = fetch(N - 1 - i);
    fetch(N - 1 - i) = tmp;
  }
}